

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O0

ssize_t gzip_filter_read(archive_read_filter *self,void **p)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  archive_read_filter *in_RSI;
  long in_RDI;
  int ret;
  ssize_t avail_in;
  size_t decompressed;
  private_data_conflict *state;
  uint in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  undefined4 local_30;
  archive_read_filter *in_stack_ffffffffffffffd8;
  long *min;
  
  min = *(long **)(in_RDI + 0x50);
  min[3] = min[0xf];
  *(int *)(min + 4) = (int)min[0x10];
  while( true ) {
    uVar1 = in_stack_ffffffffffffffc8 & 0xffffff;
    if ((int)min[4] != 0) {
      uVar1 = CONCAT13((char)min[0x13] != '\0',(int3)in_stack_ffffffffffffffc8) ^ 0xff000000;
    }
    in_stack_ffffffffffffffc8 = uVar1;
    if ((in_stack_ffffffffffffffc8 & 0x1000000) == 0) break;
    if ((char)min[0xe] == '\0') {
      iVar2 = consume_header(in_stack_ffffffffffffffd8);
      if (iVar2 == 1) {
        *(undefined1 *)(min + 0x13) = 1;
        break;
      }
      if (iVar2 < 0) {
        return (long)iVar2;
      }
    }
    pvVar3 = __archive_read_filter_ahead(in_RSI,(size_t)min,&in_stack_ffffffffffffffd8->position);
    *min = (long)pvVar3;
    if (*min == 0) {
      archive_set_error(*(archive **)(in_RDI + 0x18),-1,"truncated gzip input");
      return -0x1e;
    }
    *(undefined4 *)(min + 1) = local_30;
    iVar2 = inflate(min,0);
    if (iVar2 == 0) {
      __archive_read_filter_consume
                ((archive_read_filter *)(ulong)in_stack_ffffffffffffffc8,
                 (ulong)in_stack_ffffffffffffffc0);
    }
    else {
      if (iVar2 != 1) {
        archive_set_error(*(archive **)(in_RDI + 0x18),-1,"gzip decompression failed");
        return -0x1e;
      }
      __archive_read_filter_consume
                ((archive_read_filter *)CONCAT44(1,in_stack_ffffffffffffffc8),
                 CONCAT44(1,in_stack_ffffffffffffffc0));
      iVar2 = consume_trailer((archive_read_filter *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
      if (iVar2 < 0) {
        return (long)iVar2;
      }
    }
  }
  lVar4 = min[3] - min[0xf];
  min[0x11] = lVar4 + min[0x11];
  if (lVar4 == 0) {
    in_RSI->position = 0;
    return 0;
  }
  in_RSI->position = min[0xf];
  return lVar4;
}

Assistant:

static ssize_t
gzip_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = (uInt)state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		/* If we're not in a stream, read a header
		 * and initialize the decompression library. */
		if (!state->in_stream) {
			ret = consume_header(self);
			if (ret == ARCHIVE_EOF) {
				state->eof = 1;
				break;
			}
			if (ret < ARCHIVE_OK)
				return (ret);
		}

		/* Peek at the next available data. */
		/* ZLib treats stream.next_in as const but doesn't declare
		 * it so, hence this ugly cast. */
		state->stream.next_in = (unsigned char *)(uintptr_t)
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated gzip input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = (uInt)avail_in;

		/* Decompress and consume some of that data. */
		ret = inflate(&(state->stream), 0);
		switch (ret) {
		case Z_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			break;
		case Z_STREAM_END: /* Found end of stream. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			/* Consume the stream trailer; release the
			 * decompression library. */
			ret = consume_trailer(self);
			if (ret < ARCHIVE_OK)
				return (ret);
			break;
		default:
			/* Return an error. */
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "gzip decompression failed");
			return (ARCHIVE_FATAL);
		}
	}

	/* We've read as much as we can. */
	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else
		*p = state->out_block;
	return (decompressed);
}